

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppLayout.cpp
# Opt level: O2

void __thiscall cursespp::AppLayout::~AppLayout(AppLayout *this)

{
  (this->super_LayoutBase).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__AppLayout_001bd9a8;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__AppLayout_001bdc28;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__AppLayout_001bdc58;
  (this->super_LayoutBase).super_Window.super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__AppLayout_001bdc80;
  (this->super_LayoutBase).super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__AppLayout_001bdca8;
  (this->super_LayoutBase).super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__AppLayout_001bdd50;
  (this->super_LayoutBase).super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__AppLayout_001bdd78;
  (this->super_LayoutBase).super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__AppLayout_001bdda0;
  (this->super_LayoutBase).super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__AppLayout_001bddd0;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__AppLayout_001bde00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->lastFocus).super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->hotkey).super___shared_ptr<cursespp::TextLabel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->layout).super___shared_ptr<cursespp::LayoutBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->shortcuts).
              super___shared_ptr<cursespp::ShortcutsWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  sigslot::has_slots<sigslot::multi_threaded_local>::~has_slots
            (&this->super_has_slots<sigslot::multi_threaded_local>);
  LayoutBase::~LayoutBase(&this->super_LayoutBase);
  return;
}

Assistant:

AppLayout::~AppLayout() {
}